

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderResourceCacheGL::Initialize
          (ShaderResourceCacheGL *this,TResourceCount *ResCount,IMemoryAllocator *MemAllocator,
          Uint64 DynamicUBOSlotMask,Uint64 DynamicSSBOSlotMask)

{
  unsigned_short uVar1;
  uchar *ptr;
  uint uVar2;
  Uint16 UVar3;
  ushort uVar4;
  int iVar5;
  size_t sVar6;
  undefined4 extraout_var;
  CachedUB *pCVar7;
  CachedResourceView *pCVar8;
  CachedSSBO *pCVar9;
  char (*Args_1) [76];
  char (*Args_1_00) [74];
  char (*Args_1_01) [78];
  ulong uVar10;
  ushort uVar11;
  Uint32 UVar12;
  ulong uVar13;
  size_t __n;
  string msg;
  string local_50;
  uchar *__s;
  
  this->m_DynamicUBOSlotMask = DynamicUBOSlotMask;
  this->m_DynamicSSBOSlotMask = DynamicSSBOSlotMask;
  if ((this->m_pResourceData)._M_t.
      super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
      ._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
    FormatString<char[35]>(&local_50,(char (*) [35])"Cache has already been initialized");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x3a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  uVar1 = ResCount->_M_elems[0];
  uVar4 = uVar1 * 0x18;
  this->m_TexturesOffset = uVar4;
  uVar11 = ResCount->_M_elems[1] + uVar1;
  uVar2 = (uint)uVar11 * 0x18;
  Args_1 = (char (*) [76])(ulong)uVar2;
  this->m_ImagesOffset = (Uint16)uVar2;
  UVar3 = (uVar11 + ResCount->_M_elems[2]) * 0x18;
  this->m_SSBOsOffset = UVar3;
  this->m_MemoryEndOffset = ResCount->_M_elems[3] * 0x10 + UVar3;
  if (uVar4 / 0x18 != ResCount->_M_elems[0]) {
    FormatString<char[26],char[76]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetUBCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_UNIFORM_BUFFER])",Args_1)
    ;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x42);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar4 = this->m_TexturesOffset;
    Args_1 = (char (*) [76])(ulong)this->m_ImagesOffset;
  }
  Args_1_00 = (char (*) [74])((ulong)Args_1 & 0xffff);
  if ((uint)(((long)Args_1_00 - (ulong)uVar4) / 0x18) != (uint)ResCount->_M_elems[1]) {
    FormatString<char[26],char[74]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetTextureCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_TEXTURE])",Args_1_00
              );
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x43);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Args_1_00 = (char (*) [74])(ulong)this->m_ImagesOffset;
  }
  uVar10 = (ulong)this->m_SSBOsOffset;
  if ((uint)((uVar10 - (long)Args_1_00) / 0x18) != (uint)ResCount->_M_elems[2]) {
    FormatString<char[26],char[70]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetImageCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_IMAGE])",
               (char (*) [70])Args_1_00);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x44);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar10 = (ulong)this->m_SSBOsOffset;
  }
  uVar4 = this->m_MemoryEndOffset;
  __n = (size_t)uVar4;
  Args_1_01 = (char (*) [78])(ulong)ResCount->_M_elems[3];
  if ((uint)(__n - uVar10 >> 4) != (uint)ResCount->_M_elems[3]) {
    FormatString<char[26],char[78]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "GetSSBOCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_STORAGE_BUFFER])",
               Args_1_01);
    Args_1_01 = (char (*) [78])0x45;
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x45);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar4 = this->m_MemoryEndOffset;
    __n = (size_t)uVar4;
  }
  sVar6 = GetRequiredMemorySize(ResCount);
  if ((int)sVar6 != (int)__n) {
    FormatString<char[26],char[46]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BufferSize == GetRequiredMemorySize(ResCount)",
               (char (*) [46])Args_1_01);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
               ,0x4a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (uVar4 != 0) {
    iVar5 = (**MemAllocator->_vptr_IMemoryAllocator)
                      (MemAllocator,__n,"Shader resource cache data buffer",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
                       ,0x4f);
    __s = (uchar *)CONCAT44(extraout_var,iVar5);
    ptr = (this->m_pResourceData)._M_t.
          super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
          ._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (this->m_pResourceData)._M_t.
    super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
    ._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
    .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __s;
    if (ptr == (uchar *)0x0) {
      (this->m_pResourceData)._M_t.
      super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
      ._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
      .super__Tuple_impl<1UL,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>.
      super__Head_base<1UL,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>,_false>.
      _M_head_impl = (STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>)MemAllocator;
    }
    else {
      STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>::operator()
                ((STDDeleter<unsigned_char,_Diligent::IMemoryAllocator> *)&this->m_pResourceData,ptr
                );
      (this->m_pResourceData)._M_t.
      super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
      ._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
      .super__Tuple_impl<1UL,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>.
      super__Head_base<1UL,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>,_false>.
      _M_head_impl = (STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>)MemAllocator;
      __s = (this->m_pResourceData)._M_t.
            super___uniq_ptr_impl<unsigned_char,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
            ._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_Diligent::STDDeleter<unsigned_char,_Diligent::IMemoryAllocator>_>
            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    }
    memset(__s,0,__n);
  }
  uVar4 = this->m_TexturesOffset;
  if (0x17 < uVar4) {
    UVar12 = 0;
    do {
      pCVar7 = GetConstUB(this,UVar12);
      (pCVar7->pBuffer).m_pObject = (BufferGLImpl *)0x0;
      pCVar7->BaseOffset = 0;
      pCVar7->RangeSize = 0;
      pCVar7->DynamicOffset = 0;
      UVar12 = UVar12 + 1;
      uVar4 = this->m_TexturesOffset;
    } while (UVar12 < uVar4 / 0x18);
  }
  uVar10 = (ulong)this->m_ImagesOffset;
  if ((int)((uVar10 - uVar4) / 0x18) != 0) {
    UVar12 = 0;
    do {
      pCVar8 = GetConstTexture(this,UVar12);
      (pCVar8->pView).m_pObject = (IDeviceObject *)0x0;
      pCVar8->pTexture = (TextureBaseGL *)0x0;
      (pCVar8->field_2).pBuffer = (BufferGLImpl *)0x0;
      uVar10 = (ulong)this->m_ImagesOffset;
      UVar12 = UVar12 + 1;
    } while (UVar12 < (uint)((uVar10 - this->m_TexturesOffset) / 0x18));
  }
  uVar13 = (ulong)this->m_SSBOsOffset;
  if ((int)((uVar13 - uVar10) / 0x18) != 0) {
    UVar12 = 0;
    do {
      pCVar8 = GetConstImage(this,UVar12);
      (pCVar8->pView).m_pObject = (IDeviceObject *)0x0;
      pCVar8->pTexture = (TextureBaseGL *)0x0;
      (pCVar8->field_2).pBuffer = (BufferGLImpl *)0x0;
      uVar13 = (ulong)this->m_SSBOsOffset;
      UVar12 = UVar12 + 1;
    } while (UVar12 < (uint)((uVar13 - this->m_ImagesOffset) / 0x18));
  }
  if ((int)(this->m_MemoryEndOffset - uVar13 >> 4) != 0) {
    UVar12 = 0;
    do {
      pCVar9 = GetConstSSBO(this,UVar12);
      (pCVar9->pBufferView).m_pObject = (BufferViewGLImpl *)0x0;
      pCVar9->DynamicOffset = 0;
      UVar12 = UVar12 + 1;
    } while (UVar12 < (uint)((ulong)this->m_MemoryEndOffset - (ulong)this->m_SSBOsOffset >> 4));
  }
  return;
}

Assistant:

void ShaderResourceCacheGL::Initialize(const TResourceCount& ResCount, IMemoryAllocator& MemAllocator, Uint64 DynamicUBOSlotMask, Uint64 DynamicSSBOSlotMask)
{
    m_DynamicUBOSlotMask  = DynamicUBOSlotMask;
    m_DynamicSSBOSlotMask = DynamicSSBOSlotMask;

    VERIFY(!m_pResourceData, "Cache has already been initialized");

    // clang-format off
    m_TexturesOffset  = static_cast<Uint16>(m_UBsOffset      + sizeof(CachedUB)           * ResCount[BINDING_RANGE_UNIFORM_BUFFER]);
    m_ImagesOffset    = static_cast<Uint16>(m_TexturesOffset + sizeof(CachedResourceView) * ResCount[BINDING_RANGE_TEXTURE]);
    m_SSBOsOffset     = static_cast<Uint16>(m_ImagesOffset   + sizeof(CachedResourceView) * ResCount[BINDING_RANGE_IMAGE]);
    m_MemoryEndOffset = static_cast<Uint16>(m_SSBOsOffset    + sizeof(CachedSSBO)         * ResCount[BINDING_RANGE_STORAGE_BUFFER]);

    VERIFY_EXPR(GetUBCount()      == static_cast<Uint32>(ResCount[BINDING_RANGE_UNIFORM_BUFFER]));
    VERIFY_EXPR(GetTextureCount() == static_cast<Uint32>(ResCount[BINDING_RANGE_TEXTURE]));
    VERIFY_EXPR(GetImageCount()   == static_cast<Uint32>(ResCount[BINDING_RANGE_IMAGE]));
    VERIFY_EXPR(GetSSBOCount()    == static_cast<Uint32>(ResCount[BINDING_RANGE_STORAGE_BUFFER]));
    // clang-format on

    size_t BufferSize = m_MemoryEndOffset;

    VERIFY_EXPR(BufferSize == GetRequiredMemorySize(ResCount));

    if (BufferSize > 0)
    {
        m_pResourceData = decltype(m_pResourceData){
            ALLOCATE(MemAllocator, "Shader resource cache data buffer", Uint8, BufferSize),
            STDDeleter<Uint8, IMemoryAllocator>(MemAllocator) //
        };
        memset(m_pResourceData.get(), 0, BufferSize);
    }

    // Explicitly construct all objects
    for (Uint32 cb = 0; cb < GetUBCount(); ++cb)
        new (&GetUB(cb)) CachedUB;

    for (Uint32 s = 0; s < GetTextureCount(); ++s)
        new (&GetTexture(s)) CachedResourceView;

    for (Uint32 i = 0; i < GetImageCount(); ++i)
        new (&GetImage(i)) CachedResourceView;

    for (Uint32 s = 0; s < GetSSBOCount(); ++s)
        new (&GetSSBO(s)) CachedSSBO;
}